

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptPromise.h
# Opt level: O1

void __thiscall
Js::JavascriptPromiseReactionTaskFunction::JavascriptPromiseReactionTaskFunction
          (JavascriptPromiseReactionTaskFunction *this,DynamicType *type,FunctionInfo *functionInfo,
          JavascriptPromiseReaction *reaction,Var argument)

{
  RuntimeFunction::RuntimeFunction(&this->super_RuntimeFunction,type,functionInfo);
  (this->super_RuntimeFunction).super_JavascriptFunction.super_DynamicObject.super_RecyclableObject.
  super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject =
       (_func_int **)&PTR_Finalize_01544ec0;
  Memory::Recycler::WBSetBit((char *)&this->reaction);
  (this->reaction).ptr = reaction;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->reaction);
  Memory::Recycler::WBSetBit((char *)&this->argument);
  (this->argument).ptr = argument;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->argument);
  return;
}

Assistant:

JavascriptPromiseReactionTaskFunction(DynamicType* type, FunctionInfo* functionInfo, JavascriptPromiseReaction* reaction, Var argument)
            : RuntimeFunction(type, functionInfo), reaction(reaction), argument(argument)
        { }